

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

int count_dups<std::vector<int,std::allocator<int>>>
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *t)

{
  ulong uVar1;
  pointer __s1;
  pointer __s2;
  long lVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  pointer *ppiVar6;
  size_t __n;
  ulong uVar7;
  ulong uVar8;
  undefined8 uStack_80;
  undefined1 auStack_78 [8];
  pointer local_70;
  pointer *local_68;
  ulong local_60;
  undefined1 *local_58;
  ulong local_50;
  undefined1 *local_48;
  pointer local_40;
  int local_34;
  
  local_40 = (t->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = ((long)(t->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)local_40 >> 3) *
          -0x5555555555555555;
  lVar2 = -(lVar5 + 0xfU & 0xfffffffffffffff0);
  uVar4 = (uint)lVar5;
  local_34 = 0;
  local_48 = auStack_78 + lVar2;
  *(undefined8 *)((long)&uStack_80 + lVar2) = 0x10b8e9;
  memset(auStack_78 + lVar2,0,(long)(int)uVar4);
  if (0 < (int)uVar4) {
    uVar7 = (ulong)(uVar4 & 0x7fffffff);
    ppiVar6 = (pointer *)
              ((long)&local_40[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + 8);
    local_60 = 0;
    local_34 = 0;
    local_50 = uVar7;
    local_58 = local_48;
    do {
      local_58 = local_58 + 1;
      uVar7 = uVar7 - 1;
      uVar1 = local_60 + 1;
      local_68 = ppiVar6;
      if ((local_48[local_60] == '\0') && (uVar1 < local_50)) {
        __s1 = local_40[local_60].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        local_70 = *(pointer *)
                    ((long)&local_40[local_60].super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data + 8);
        __n = (long)local_70 - (long)__s1;
        uVar8 = 0;
        local_60 = uVar1;
        do {
          __s2 = ((_Vector_impl_data *)(ppiVar6 + -1))->_M_start;
          if (__n == (long)*ppiVar6 - (long)__s2) {
            if (local_70 != __s1) {
              *(undefined8 *)((long)&uStack_80 + lVar2) = 0x10b976;
              iVar3 = bcmp(__s1,__s2,__n);
              if (iVar3 != 0) goto LAB_0010b986;
            }
            local_34 = local_34 + 1;
            local_58[uVar8] = 1;
          }
LAB_0010b986:
          uVar8 = uVar8 + 1;
          ppiVar6 = ppiVar6 + 3;
          uVar1 = local_60;
        } while (uVar7 != uVar8);
      }
      local_60 = uVar1;
      ppiVar6 = local_68 + 3;
    } while (local_60 != local_50);
  }
  return local_34;
}

Assistant:

int count_dups(std::vector<T> &t)
{
    int dups = 0;
    int N = t.size();
    STACKALLOC(bool, mark, t.size());
    memset(mark, 0, N);
    for(int i=0; i<N; ++i) {
        if(mark[i])
            continue;
        for(int j=i+1; j<N; ++j) {
            if(t[i] == t[j]) {
                dups++;
                mark[j] = true;
            }
        }
    }
    return dups;
}